

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ellipsoid.cpp
# Opt level: O2

bool __thiscall OpenMD::Ellipsoid::isInterior(Ellipsoid *this,Vector3d *pos)

{
  Vector3d rbody;
  Vector3d r;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  Vector<double,_3U> local_30;
  
  operator-(&local_60,&pos->super_Vector<double,_3U>,&(this->origin_).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&local_30,&local_60);
  operator*(&local_48,(RectMatrix<double,_3U,_3U> *)&this->rotMat_,&local_30);
  Vector<double,_3U>::Vector(&local_60,&local_48);
  local_60.data_[0] = local_60.data_[0] / this->rEquatorial_;
  local_60.data_[1] = local_60.data_[1] / this->rEquatorial_;
  local_60.data_[2] = local_60.data_[2] / this->rAxial_;
  return local_60.data_[2] * local_60.data_[2] +
         local_60.data_[0] * local_60.data_[0] + local_60.data_[1] * local_60.data_[1] < 1.0;
}

Assistant:

bool Ellipsoid::isInterior(Vector3d pos) {
    Vector3d r     = pos - origin_;
    Vector3d rbody = rotMat_ * r;

    RealType xoverb = rbody[0] / rEquatorial_;
    RealType yoverb = rbody[1] / rEquatorial_;
    RealType zovera = rbody[2] / rAxial_;

    bool result;
    if (xoverb * xoverb + yoverb * yoverb + zovera * zovera < 1)
      result = true;
    else
      result = false;

    return result;
  }